

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ArrayAllocate(sqlite3 *db,void *pArray,int szEntry,int *pnEntry,int *pIdx)

{
  int iVar1;
  ulong uVar2;
  long local_60;
  void *pNew;
  sqlite3_int64 sz;
  sqlite3_int64 n;
  char *z;
  int *pIdx_local;
  int *pnEntry_local;
  void *pvStack_20;
  int szEntry_local;
  void *pArray_local;
  sqlite3 *db_local;
  
  iVar1 = *pnEntry;
  *pIdx = iVar1;
  uVar2 = (ulong)iVar1;
  pvStack_20 = pArray;
  if ((uVar2 & uVar2 - 1) == 0) {
    if (uVar2 == 0) {
      local_60 = 1;
    }
    else {
      local_60 = uVar2 << 1;
    }
    pvStack_20 = sqlite3DbRealloc(db,pArray,local_60 * szEntry);
    if (pvStack_20 == (void *)0x0) {
      *pIdx = -1;
      return pArray;
    }
  }
  memset((void *)((long)pvStack_20 + uVar2 * (long)szEntry),0,(long)szEntry);
  *pnEntry = *pnEntry + 1;
  return pvStack_20;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ArrayAllocate(
  sqlite3 *db,      /* Connection to notify of malloc failures */
  void *pArray,     /* Array of objects.  Might be reallocated */
  int szEntry,      /* Size of each object in the array */
  int *pnEntry,     /* Number of objects currently in use */
  int *pIdx         /* Write the index of a new slot here */
){
  char *z;
  sqlite3_int64 n = *pIdx = *pnEntry;
  if( (n & (n-1))==0 ){
    sqlite3_int64 sz = (n==0) ? 1 : 2*n;
    void *pNew = sqlite3DbRealloc(db, pArray, sz*szEntry);
    if( pNew==0 ){
      *pIdx = -1;
      return pArray;
    }
    pArray = pNew;
  }
  z = (char*)pArray;
  memset(&z[n * szEntry], 0, szEntry);
  ++*pnEntry;
  return pArray;
}